

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

void nn_sipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *local_30;
  nn_sipc *sipc;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_30 = self;
  if (self == (nn_fsm *)0x0) {
    local_30 = (nn_fsm *)0x0;
  }
  if (src == -2 && type == -3) {
    nn_pipebase_stop((nn_pipebase *)(local_30 + 6));
    nn_streamhdr_stop((nn_streamhdr *)&local_30[1].state);
    *(undefined4 *)&local_30[1].fn = 7;
  }
  if (*(int *)&local_30[1].fn == 7) {
    iVar1 = nn_streamhdr_isidle((nn_streamhdr *)&local_30[1].state);
    if (iVar1 != 0) {
      nn_usock_swap_owner((nn_usock *)local_30[1].shutdown_fn,
                          (nn_fsm_owner *)&local_30[5].stopped.type);
      local_30[1].shutdown_fn = (nn_fsm_fn)0x0;
      local_30[5].stopped.type = -1;
      local_30[5].stopped.item.next = (nn_queue_item *)0x0;
      *(undefined4 *)&local_30[1].fn = 1;
      nn_fsm_stopped(local_30,2);
    }
    return;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)&local_30[1].fn,(ulong)(uint)src,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
          ,0xca);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_pipebase_stop (&sipc->pipebase);
        nn_streamhdr_stop (&sipc->streamhdr);
        sipc->state = NN_SIPC_STATE_STOPPING;
    }
    if (nn_slow (sipc->state == NN_SIPC_STATE_STOPPING)) {
        if (nn_streamhdr_isidle (&sipc->streamhdr)) {
            nn_usock_swap_owner (sipc->usock, &sipc->usock_owner);
            sipc->usock = NULL;
            sipc->usock_owner.src = -1;
            sipc->usock_owner.fsm = NULL;
            sipc->state = NN_SIPC_STATE_IDLE;
            nn_fsm_stopped (&sipc->fsm, NN_SIPC_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state(sipc->state, src, type);
}